

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddCount.c
# Opt level: O1

int cuddZddCountStep(DdNode *P,st__table *table,DdNode *base,DdNode *empty)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *in_RAX;
  int *dummy;
  int *local_38;
  
  if (P == empty) {
    iVar1 = 0;
  }
  else if (P == base) {
    iVar1 = 1;
  }
  else {
    local_38 = in_RAX;
    iVar1 = st__lookup(table,(char *)P,(char **)&local_38);
    if (iVar1 == 0) {
      iVar1 = cuddZddCountStep((P->type).kids.E,table,base,empty);
      iVar2 = cuddZddCountStep((P->type).kids.T,table,base,empty);
      local_38 = (int *)malloc(4);
      if (local_38 != (int *)0x0) {
        *local_38 = iVar2 + iVar1;
        iVar3 = st__insert(table,(char *)P,(char *)local_38);
        if (iVar3 != -10000) {
          return iVar2 + iVar1;
        }
        if (local_38 != (int *)0x0) {
          free(local_38);
        }
      }
      iVar1 = -1;
    }
    else {
      iVar1 = *local_38;
    }
  }
  return iVar1;
}

Assistant:

static int
cuddZddCountStep(
  DdNode * P,
  st__table * table,
  DdNode * base,
  DdNode * empty)
{
    int         res;
    int         *dummy;

    if (P == empty)
        return(0);
    if (P == base)
        return(1);

    /* Check cache. */
    if ( st__lookup(table, (const char *)P, (char **)&dummy)) {
        res = *dummy;
        return(res);
    }

    res = cuddZddCountStep(cuddE(P), table, base, empty) +
        cuddZddCountStep(cuddT(P), table, base, empty);

    dummy = ABC_ALLOC(int, 1);
    if (dummy == NULL) {
        return(CUDD_OUT_OF_MEM);
    }
    *dummy = res;
    if ( st__insert(table, (char *)P, (char *)dummy) == st__OUT_OF_MEM) {
        ABC_FREE(dummy);
        return(CUDD_OUT_OF_MEM);
    }

    return(res);

}